

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::MemoryOutputStream
          (MemoryOutputStream *this,GeneratorContextImpl *directory,string *filename,
          string *insertion_point)

{
  string *in_RCX;
  string *in_RDX;
  _func_int **in_RSI;
  ZeroCopyOutputStream *in_RDI;
  string *in_stack_ffffffffffffff98;
  StringOutputStream *this_00;
  
  io::ZeroCopyOutputStream::ZeroCopyOutputStream(in_RDI);
  in_RDI->_vptr_ZeroCopyOutputStream = (_func_int **)&PTR__MemoryOutputStream_00893e78;
  in_RDI[1]._vptr_ZeroCopyOutputStream = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 6),in_RCX);
  this_00 = (StringOutputStream *)(in_RDI + 10);
  std::__cxx11::string::string((string *)this_00);
  operator_new(0x10);
  io::StringOutputStream::StringOutputStream(this_00,in_stack_ffffffffffffff98);
  std::
  unique_ptr<google::protobuf::io::StringOutputStream,std::default_delete<google::protobuf::io::StringOutputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::StringOutputStream>,void>
            ((unique_ptr<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
              *)this_00,(pointer)in_stack_ffffffffffffff98);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::MemoryOutputStream(
    GeneratorContextImpl* directory, const std::string& filename,
    const std::string& insertion_point)
    : directory_(directory),
      filename_(filename),
      insertion_point_(insertion_point),
      inner_(new io::StringOutputStream(&data_)) {}